

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_get_str_kv_size_test(void)

{
  uint64_t uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  bnode *pbVar6;
  bnode *pbVar7;
  size_t sVar8;
  ushort *puVar9;
  long lVar10;
  undefined8 unaff_RBP;
  char *pcVar11;
  undefined8 *puVar12;
  char *__s2;
  ulong __n;
  long lVar13;
  int v;
  void *key;
  timeval __test_begin;
  undefined2 *puStack_3f0;
  undefined4 uStack_3e4;
  timeval tStack_3e0;
  btree bStack_3d0;
  btree_kv_ops bStack_390;
  long lStack_318;
  char *pcStack_310;
  long lStack_308;
  code *pcStack_300;
  btree_kv_ops bStack_2f8;
  undefined8 uStack_280;
  timeval tStack_278;
  undefined8 auStack_268 [7];
  btree_kv_ops *pbStack_230;
  bnode *pbStack_228;
  bnode *pbStack_220;
  char cStack_212;
  char cStack_211;
  bnode *pbStack_210;
  long *plStack_208;
  char *pcStack_200;
  uint64_t uStack_1f8;
  bnode *pbStack_1f0;
  code *pcStack_1e8;
  undefined2 *puStack_1e0;
  long lStack_1d8;
  bnode *apbStack_1d0 [4];
  timeval tStack_1b0;
  btree_kv_ops bStack_1a0;
  uint8_t *puStack_128;
  btree *pbStack_120;
  undefined4 local_f4;
  undefined2 *local_f0;
  timeval local_e8;
  btree local_d8;
  btree_kv_ops local_98;
  
  gettimeofday(&local_e8,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&local_98);
  local_d8.vsize = 4;
  local_f4 = 1;
  local_f0 = (undefined2 *)malloc(0xd);
  *local_f0 = 0xb00;
  *(undefined8 *)(local_f0 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)local_f0 + 9) = 0x676e69;
  sVar5 = (*local_98.get_kv_size)(&local_d8,&local_f0,&local_f4);
  if (sVar5 != (ulong)local_d8.vsize + 0xd) {
    kv_get_str_kv_size_test();
  }
  sVar5 = (*local_98.get_kv_size)(&local_d8,(void *)0x0,&local_f4);
  if (sVar5 != local_d8.vsize) {
    kv_get_str_kv_size_test();
  }
  sVar5 = (*local_98.get_kv_size)(&local_d8,&local_f0,(void *)0x0);
  if (sVar5 == 0xd) {
    sVar5 = (*local_98.get_kv_size)(&local_d8,(void *)0x0,(void *)0x0);
    if (sVar5 == 0) {
      kv_get_str_kv_size_test();
      return;
    }
  }
  else {
    kv_get_str_kv_size_test();
  }
  kv_get_str_kv_size_test();
  pcStack_1e8 = (code *)0x103f53;
  puStack_128 = &local_d8.vsize;
  pbStack_120 = &local_d8;
  gettimeofday(&tStack_1b0,(__timezone_ptr_t)0x0);
  pcStack_1e8 = (code *)0x103f58;
  memleak_start();
  pcStack_1e8 = (code *)0x103f65;
  btree_str_kv_get_kb64_vb64(&bStack_1a0);
  lStack_1d8 = 0x40;
  pcStack_1e8 = (code *)0x103f7c;
  pbVar6 = (bnode *)malloc(0x1010);
  pbVar6->kvsize = 0;
  pbVar6->flag = 0;
  pbVar6->level = 0;
  pbVar6->nentry = 0;
  (pbVar6->field_4).data = (void *)0x0;
  pbVar6->kvsize = 0xd08;
  pbVar6->level = 1;
  (pbVar6->field_4).data = pbVar6 + 1;
  pcStack_1e8 = (code *)0x103fa8;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0xd08;
  pbVar7->level = 1;
  (pbVar7->field_4).data = pbVar7 + 1;
  pcStack_1e8 = (code *)0x103fcb;
  puStack_1e0 = (undefined2 *)malloc(0xd);
  *puStack_1e0 = 0xb00;
  *(undefined8 *)(puStack_1e0 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_1e0 + 9) = 0x676e69;
  pcStack_1e8 = (code *)0x103ffe;
  (*bStack_1a0.set_kv)(pbVar7,0,&puStack_1e0,&lStack_1d8);
  pcStack_1e8 = (code *)0x104012;
  (*bStack_1a0.copy_kv)(pbVar6,pbVar7,0,0,1);
  uVar1 = (pbVar6->field_4).dummy;
  pcStack_1e8 = (code *)0x104022;
  iVar3 = strcmp((char *)(uVar1 + 2),"teststring");
  if (iVar3 == 0) {
    if (*(long *)(uVar1 + 0xd) == lStack_1d8) {
      apbStack_1d0[0] = pbVar7;
      apbStack_1d0[1] = pbVar6;
      apbStack_1d0[2] = (bnode *)puStack_1e0;
      lVar10 = 0;
      do {
        pcStack_1e8 = (code *)0x104050;
        free(apbStack_1d0[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      pcStack_1e8 = (code *)0x10405e;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (kv_copy_var_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_1e8 = (code *)0x10408f;
      fprintf(_stderr,pcVar11,"kv_copy_var_test");
      return;
    }
  }
  else {
    pcStack_1e8 = (code *)0x1040a6;
    kv_copy_var_test();
  }
  pcStack_1e8 = kv_copy_var_nentry_test;
  kv_copy_var_test();
  pcStack_200 = "teststring";
  lVar10 = 0;
  uStack_280 = 0x1040cd;
  pbStack_210 = pbVar6;
  plStack_208 = &lStack_1d8;
  uStack_1f8 = uVar1;
  pbStack_1f0 = pbVar7;
  pcStack_1e8 = (code *)CONCAT62((int6)((ulong)unaff_RBP >> 0x10),0xd08);
  gettimeofday(&tStack_278,(__timezone_ptr_t)0x0);
  uStack_280 = 0x1040d2;
  memleak_start();
  do {
    pcVar11 = *(char **)((long)&DAT_00109d70 + lVar10);
    uStack_280 = 0x1040e5;
    sVar8 = strlen(pcVar11);
    uVar4 = (int)sVar8 + 1;
    __n = (ulong)(uVar4 & 0xffff);
    uStack_280 = 0x1040f4;
    puVar9 = (ushort *)malloc(__n + 2);
    uVar2 = (ushort)uVar4;
    *puVar9 = uVar2 << 8 | uVar2 >> 8;
    uStack_280 = 0x104111;
    memcpy(puVar9 + 1,pcVar11,__n);
    *(ushort **)((long)auStack_268 + lVar10) = puVar9;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x30);
  uStack_280 = 0x10412a;
  pbVar6 = (bnode *)malloc(0x1010);
  pbVar6->kvsize = 0;
  pbVar6->flag = 0;
  pbVar6->level = 0;
  pbVar6->nentry = 0;
  (pbVar6->field_4).data = (void *)0x0;
  pbVar6->kvsize = 0x901;
  pbVar6->level = 1;
  pbVar6->nentry = 6;
  (pbVar6->field_4).data = pbVar6 + 1;
  cStack_212 = 'd';
  pcStack_300 = (code *)0x104161;
  btree_str_kv_get_kb64_vb64(&bStack_2f8);
  puVar12 = auStack_268;
  lVar10 = 0;
  do {
    pcStack_300 = (code *)0x104177;
    (*bStack_2f8.set_kv)(pbVar6,(idx_t)lVar10,puVar12,&cStack_212);
    lVar10 = lVar10 + 1;
    puVar12 = puVar12 + 1;
  } while (lVar10 != 6);
  pcStack_300 = (code *)0x10418e;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0x901;
  pbVar7->level = 1;
  (pbVar7->field_4).data = pbVar7 + 1;
  lVar10 = 0;
  pcStack_300 = (code *)0x1041cb;
  pbStack_230 = &bStack_2f8;
  pbStack_228 = pbVar6;
  (*bStack_2f8.copy_kv)(pbVar7,pbVar6,0,3,3);
  uVar1 = (pbVar7->field_4).dummy;
  cStack_211 = cStack_212;
  pcVar11 = (char *)(uVar1 + 2);
  lVar13 = 0;
  pbStack_220 = pbVar7;
  do {
    __s2 = (char *)(&DAT_00109d88)[lVar10];
    pcStack_300 = (code *)0x1041fb;
    iVar3 = strcmp(pcVar11 + lVar13,__s2);
    if (iVar3 != 0) {
LAB_0010439f:
      pcStack_300 = (code *)0x1043a4;
      kv_copy_var_nentry_test();
      goto LAB_001043a4;
    }
    pcStack_300 = (code *)0x10420b;
    sVar8 = strlen(__s2);
    pbVar6 = pbStack_220;
    if (*(char *)(uVar1 + 3 + lVar13 + sVar8) != cStack_211) {
      pcStack_300 = (code *)0x10439f;
      kv_copy_var_nentry_test();
      goto LAB_0010439f;
    }
    lVar13 = lVar13 + sVar8 + 4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  pcStack_300 = (code *)0x104251;
  (*pbStack_230->copy_kv)(pbStack_220,pbStack_228,3,0,6);
  uVar1 = (pbVar6->field_4).dummy;
  cStack_211 = cStack_212;
  pcVar11 = (char *)(uVar1 + 2);
  do {
    __s2 = *(char **)((long)&DAT_00109d70 + lVar10);
    pcStack_300 = (code *)0x104279;
    iVar3 = strcmp(pcVar11 + lVar13,__s2);
    if (iVar3 != 0) goto LAB_001043a9;
    pcStack_300 = (code *)0x104289;
    sVar8 = strlen(__s2);
    pbVar6 = pbStack_220;
    if (*(char *)(uVar1 + 3 + lVar13 + sVar8) != cStack_211) goto LAB_001043a4;
    lVar13 = lVar13 + sVar8 + 4;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x30);
  lVar10 = 0;
  pcStack_300 = (code *)0x1042cd;
  (*pbStack_230->copy_kv)(pbStack_220,pbStack_228,0,0,6);
  __s2 = (char *)(pbVar6->field_4).dummy;
  cStack_211 = cStack_212;
  lVar13 = 0;
  while( true ) {
    pcVar11 = *(char **)((long)&DAT_00109d70 + lVar10);
    pcStack_300 = (code *)0x1042f8;
    iVar3 = strcmp(__s2 + lVar13 + 2,pcVar11);
    if (iVar3 != 0) break;
    pcStack_300 = (code *)0x104308;
    sVar8 = strlen(pcVar11);
    if (__s2[lVar13 + sVar8 + 3] != cStack_211) goto LAB_001043ae;
    lVar13 = lVar13 + sVar8 + 4;
    lVar10 = lVar10 + 8;
    if (lVar10 == 0x30) {
      pcStack_300 = (code *)0x104337;
      free(pbStack_228);
      pcStack_300 = (code *)0x104340;
      free(pbStack_220);
      lVar10 = 0;
      do {
        pcStack_300 = (code *)0x10434c;
        free((void *)auStack_268[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      pcStack_300 = (code *)0x10435a;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (kv_copy_var_nentry_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_300 = (code *)0x10438b;
      fprintf(_stderr,pcVar11,"kv_copy_var_nentry_test");
      return;
    }
  }
LAB_001043b3:
  pcStack_300 = kv_free_kv_var_test;
  kv_copy_var_nentry_test();
  lStack_318 = lVar10;
  pcStack_310 = __s2;
  lStack_308 = lVar13;
  pcStack_300 = (code *)pcVar11;
  gettimeofday(&tStack_3e0,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&bStack_390);
  bStack_3d0.vsize = '\x04';
  uStack_3e4 = 1;
  puStack_3f0 = (undefined2 *)malloc(0xd);
  *puStack_3f0 = 0xb00;
  *(undefined8 *)(puStack_3f0 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_3f0 + 9) = 0x676e69;
  (*bStack_390.free_kv_var)(&bStack_3d0,&puStack_3f0,&uStack_3e4);
  if (puStack_3f0 != (undefined2 *)0x0) {
    kv_free_kv_var_test();
  }
  (*bStack_390.free_kv_var)(&bStack_3d0,&puStack_3f0,&uStack_3e4);
  if (puStack_3f0 != (undefined2 *)0x0) {
    kv_free_kv_var_test();
  }
  memleak_end();
  pcVar11 = "%s PASSED\n";
  if (kv_free_kv_var_test()::__test_pass != '\0') {
    pcVar11 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar11,"kv_free_kv_var_test");
  return;
LAB_001043a4:
  pcStack_300 = (code *)0x1043a9;
  kv_copy_var_nentry_test();
LAB_001043a9:
  pcStack_300 = (code *)0x1043ae;
  kv_copy_var_nentry_test();
LAB_001043ae:
  pcStack_300 = (code *)0x1043b3;
  kv_copy_var_nentry_test();
  goto LAB_001043b3;
}

Assistant:

void kv_get_str_kv_size_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    size_t size;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, &key, (void *)&v);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t) + tree->vsize));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree, &key, NULL);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    free(key);
    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}